

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O3

int __thiscall ON_PolyEdgeCurve::FindCurve(ON_PolyEdgeCurve *this,ON_Curve *curve)

{
  int iVar1;
  ON_PolyEdgeSegment *this_00;
  ON_Curve *pOVar2;
  int segment_index;
  
  if ((curve != (ON_Curve *)0x0) &&
     (iVar1 = ON_PolyCurve::Count(&this->super_ON_PolyCurve), 0 < iVar1)) {
    segment_index = 0;
    do {
      this_00 = SegmentCurve(this,segment_index);
      if (this_00 != (ON_PolyEdgeSegment *)0x0) {
        if (this_00 == (ON_PolyEdgeSegment *)curve) {
          return segment_index;
        }
        pOVar2 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
        if (pOVar2 == curve) {
          return segment_index;
        }
        if (this_00->m_edge == (ON_BrepEdge *)curve) {
          return segment_index;
        }
      }
      segment_index = segment_index + 1;
    } while (iVar1 != segment_index);
  }
  return -1;
}

Assistant:

int ON_PolyEdgeCurve::FindCurve( const ON_Curve* curve) const
{
  int rc = -1;
  if ( 0 != curve )
  {
    int i, count = SegmentCount();
    for( i = 0; i < count; i++)
    {
      ON_PolyEdgeSegment* segment = SegmentCurve(i);
      if (    0 != segment 
           && (curve == segment || curve == segment->ProxyCurve() || curve == segment->BrepEdge()) )
      {
        rc = i;
        break;
      }
    }
  }
  return rc;
}